

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmh.h
# Opt level: O2

carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL> * __thiscall
frozen::bits::pmh_buckets<8UL>::get_sorted_buckets
          (carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL> *__return_storage_ptr__,
          pmh_buckets<8UL> *this)

{
  bucket_size_compare local_9;
  
  pmh_buckets<8ul>::make_bucket_refs<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>();
  quicksort<frozen::bits::pmh_buckets<8ul>::bucket_ref*,frozen::bits::bucket_size_compare>
            (__return_storage_ptr__->data_,__return_storage_ptr__->data_ + 7,&local_9);
  return __return_storage_ptr__;
}

Assistant:

carray<bucket_ref, M> constexpr get_sorted_buckets() const {
    carray<bucket_ref, M> result{this->make_bucket_refs(std::make_index_sequence<M>())};
    bits::quicksort(result.begin(), result.end() - 1, bucket_size_compare{});
    return result;
  }